

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_delete.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  bool bVar2;
  _Alloc_hider _Var3;
  int iVar4;
  long *plVar5;
  htEntry *phVar6;
  string *psVar7;
  size_type *psVar8;
  ulong uVar9;
  unsigned_long uVar10;
  void *pvVar11;
  size_t para;
  size_t para_00;
  unsigned_long __val;
  void *pvVar12;
  char cVar13;
  char cVar14;
  ulong uVar15;
  string __str_1;
  string __str;
  HotRing ht;
  string local_d0;
  string local_b0;
  string local_90;
  HotRing local_70;
  
  HotRingInstance::HotRing::HotRing(&local_70,3000);
  uVar15 = 0;
  do {
    cVar13 = '\x01';
    if (9 < uVar15) {
      uVar9 = uVar15;
      cVar14 = '\x04';
      do {
        cVar13 = cVar14;
        if (uVar9 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_001023ad;
        }
        if (uVar9 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_001023ad;
        }
        if (uVar9 < 10000) goto LAB_001023ad;
        bVar2 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar14 = cVar13 + '\x04';
      } while (bVar2);
      cVar13 = cVar13 + '\x01';
    }
LAB_001023ad:
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_b0,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_b0._M_dataplus._M_p,(uint)local_b0._M_string_length,uVar15);
    cVar13 = '\x01';
    if (9 < uVar15) {
      uVar9 = uVar15;
      cVar14 = '\x04';
      do {
        cVar13 = cVar14;
        if (uVar9 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_00102424;
        }
        if (uVar9 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_00102424;
        }
        if (uVar9 < 10000) goto LAB_00102424;
        bVar2 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar14 = cVar13 + '\x04';
      } while (bVar2);
      cVar13 = cVar13 + '\x01';
    }
LAB_00102424:
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_d0,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,uVar15);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_90.field_2._M_allocated_capacity = *psVar8;
      local_90.field_2._8_8_ = plVar5[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar8;
      local_90._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_90._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    HotRingInstance::HotRing::insert(&local_70,&local_b0,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 30000);
  uVar15 = 0;
  paVar1 = &local_d0.field_2;
  do {
    cVar13 = '\x01';
    if (9 < uVar15) {
      uVar9 = uVar15;
      cVar14 = '\x04';
      do {
        cVar13 = cVar14;
        if (uVar9 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_0010256d;
        }
        if (uVar9 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_0010256d;
        }
        if (uVar9 < 10000) goto LAB_0010256d;
        bVar2 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar14 = cVar13 + '\x04';
      } while (bVar2);
      cVar13 = cVar13 + '\x01';
    }
LAB_0010256d:
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_d0,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,uVar15);
    iVar4 = HotRingInstance::HotRing::remove(&local_70,(char *)&local_d0);
    if ((char)iVar4 == '\0') {
      __assert_fail("ht.remove(to_string(i))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Super-long[P]HotRing-s/update_delete.cpp"
                    ,0x1a,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 15000);
  uVar15 = 0;
  do {
    if (uVar15 < 15000) {
      cVar13 = '\x01';
      if (9 < uVar15) {
        uVar9 = uVar15;
        cVar14 = '\x04';
        do {
          cVar13 = cVar14;
          if (uVar9 < 100) {
            cVar13 = cVar13 + -2;
            goto LAB_001026bd;
          }
          if (uVar9 < 1000) {
            cVar13 = cVar13 + -1;
            goto LAB_001026bd;
          }
          if (uVar9 < 10000) goto LAB_001026bd;
          bVar2 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          cVar14 = cVar13 + '\x04';
        } while (bVar2);
        cVar13 = cVar13 + '\x01';
      }
LAB_001026bd:
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_d0,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,uVar15);
      phVar6 = HotRingInstance::HotRing::search(&local_70,&local_d0);
      if (phVar6 != (htEntry *)0x0) {
        __assert_fail("!ht.search(to_string(i))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Super-long[P]HotRing-s/update_delete.cpp"
                      ,0x1f,"int main()");
      }
    }
    else {
      uVar9 = uVar15;
      cVar13 = '\x04';
      do {
        cVar14 = cVar13;
        if (uVar9 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0010267f;
        }
        if (uVar9 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0010267f;
        }
        if (uVar9 < 10000) goto LAB_0010267f;
        bVar2 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar13 = cVar14 + '\x04';
      } while (bVar2);
      cVar14 = cVar14 + '\x01';
LAB_0010267f:
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_d0,cVar14);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,uVar15);
      phVar6 = HotRingInstance::HotRing::search(&local_70,&local_d0);
      if (phVar6 == (htEntry *)0x0) {
        __assert_fail("ht.search(to_string(i))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Super-long[P]HotRing-s/update_delete.cpp"
                      ,0x21,"int main()");
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 30000);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Pass remove test.\n",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  __val = 30000;
  do {
    uVar10 = __val;
    cVar13 = '\x04';
    do {
      cVar14 = cVar13;
      if (uVar10 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_001027b4;
      }
      if (uVar10 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_001027b4;
      }
      if (uVar10 < 10000) goto LAB_001027b4;
      bVar2 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar13 = cVar14 + '\x04';
    } while (bVar2);
    cVar14 = cVar14 + '\x01';
LAB_001027b4:
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_d0,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,__val);
    iVar4 = HotRingInstance::HotRing::remove(&local_70,(char *)&local_d0);
    if ((char)iVar4 != '\0') {
      __assert_fail("!ht.remove(to_string(i))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Super-long[P]HotRing-s/update_delete.cpp"
                    ,0x28,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    __val = __val + 1;
  } while (__val != 60000);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Pass remove out of bound test.\n",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  pvVar12 = (void *)0x3a98;
  do {
    pvVar11 = pvVar12;
    cVar13 = '\x04';
    do {
      cVar14 = cVar13;
      if (pvVar11 < (void *)0x64) {
        cVar14 = cVar14 + -2;
        goto LAB_001028af;
      }
      if (pvVar11 < (void *)0x3e8) {
        cVar14 = cVar14 + -1;
        goto LAB_001028af;
      }
      if (pvVar11 < (void *)0x2710) goto LAB_001028af;
      bVar2 = (void *)0x1869f < pvVar11;
      pvVar11 = (void *)((ulong)pvVar11 / 10000);
      cVar13 = cVar14 + '\x04';
    } while (bVar2);
    cVar14 = cVar14 + '\x01';
LAB_001028af:
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_d0,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,(unsigned_long)pvVar12);
    main::$_1::operator()[abi_cxx11_(&local_b0,pvVar12,para);
    HotRingInstance::HotRing::update(&local_70,&local_d0,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    pvVar12 = (void *)((long)pvVar12 + 1);
  } while (pvVar12 != (void *)0x7530);
  pvVar12 = (void *)0x3a98;
  do {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    pvVar11 = pvVar12;
    cVar13 = '\x04';
    do {
      cVar14 = cVar13;
      if (pvVar11 < (void *)0x64) {
        cVar14 = cVar14 + -2;
        goto LAB_00102981;
      }
      if (pvVar11 < (void *)0x3e8) {
        cVar14 = cVar14 + -1;
        goto LAB_00102981;
      }
      if (pvVar11 < (void *)0x2710) goto LAB_00102981;
      bVar2 = (void *)0x1869f < pvVar11;
      pvVar11 = (void *)((ulong)pvVar11 / 10000);
      cVar13 = cVar14 + '\x04';
    } while (bVar2);
    cVar14 = cVar14 + '\x01';
LAB_00102981:
    std::__cxx11::string::_M_construct((ulong)&local_d0,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,(unsigned_long)pvVar12);
    phVar6 = HotRingInstance::HotRing::search(&local_70,&local_d0);
    psVar7 = HotRingInstance::htEntry::get_val_abi_cxx11_(phVar6);
    main::$_1::operator()[abi_cxx11_(&local_b0,pvVar12,para_00);
    _Var3._M_p = local_b0._M_dataplus._M_p;
    __n = psVar7->_M_string_length;
    if (__n != CONCAT44(local_b0._M_string_length._4_4_,(uint)local_b0._M_string_length)) {
LAB_00102ab0:
      __assert_fail("ht.search(to_string(i))->get_val() == changeUpdateValue(i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Super-long[P]HotRing-s/update_delete.cpp"
                    ,0x32,"int main()");
    }
    if (__n != 0) {
      iVar4 = bcmp((psVar7->_M_dataplus)._M_p,local_b0._M_dataplus._M_p,__n);
      if (iVar4 != 0) goto LAB_00102ab0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != &local_b0.field_2) {
      operator_delete(_Var3._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    pvVar12 = (void *)((long)pvVar12 + 1);
    if (pvVar12 == (void *)0x7530) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Pass update test.\n",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
      if (local_70.table.
          super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.table.
                        super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.table.
                              super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.table.
                              super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return 0;
    }
  } while( true );
}

Assistant:

int main(){
    HotRingInstance::HotRing ht(buckets);
    auto changeValue = [](size_t para) -> string {
        return to_string(para) + "a";
    };

    auto changeUpdateValue = [](size_t para) -> string {
        return to_string(para) + "aaaaa";
    };

    for (size_t i = 0; i < buckets*len; i++){ // 链平均长度为3
        ht.insert(to_string(i), changeValue(i));
    }


    for (size_t i = 0; i < buckets*len/2; i++){
        assert(ht.remove(to_string(i)));
    }

    for (size_t i = 0; i < buckets*len; i++){
        if(i < buckets*len/2){
            assert(!ht.search(to_string(i)));
        } else {
            assert(ht.search(to_string(i)));
        }
    }

    cout << "Pass remove test.\n" << endl;

    for (size_t i = buckets*len; i < buckets*len*2; i++){
        assert(!ht.remove(to_string(i)));
    }

    cout << "Pass remove out of bound test.\n" << endl;

    for (size_t i = buckets*len/2; i < buckets*len; i++){
        ht.update(to_string(i), changeUpdateValue(i));
    }

    for (size_t i = buckets*len/2; i < buckets*len; i++){
        assert(ht.search(to_string(i))->get_val() == changeUpdateValue(i));
    }

    cout << "Pass update test.\n" << endl;
    return 0;
}